

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_ustar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  wchar_t *pwVar5;
  dev_t dVar6;
  archive_string local_48;
  
  pcVar4 = archive_entry_pathname(entry);
  pwVar5 = archive_entry_pathname_w(entry);
  if (((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) &&
     ((pwVar5 == (wchar_t *)0x0 || (*pwVar5 == L'\0')))) {
    local_48.s = (char *)0x0;
    wVar2 = L'\0';
    local_48.buffer_length = 0;
    local_48.length = 0;
    if ((*(char *)((long)h + 0x159) != '\0') &&
       (archive_strncat(&local_48,(void *)((long)h + 0x159),0x9b),
       local_48.s[local_48.length - 1] != '/')) {
      archive_strappend_char(&local_48,'/');
    }
    archive_strncat(&local_48,h,100);
    wVar3 = _archive_entry_copy_pathname_l(entry,local_48.s,local_48.length,tar->sconv);
    if ((wVar3 != L'\0') &&
       (wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname"), wVar2 == L'\xffffffe2')) {
      return L'\xffffffe2';
    }
    archive_string_free(&local_48);
  }
  else {
    wVar2 = L'\0';
  }
  wVar1 = header_common(a,tar,entry,h);
  wVar3 = L'\xffffffe2';
  if (wVar1 != L'\xffffffe2') {
    wVar3 = wVar2;
    if (wVar1 < wVar2) {
      wVar3 = wVar1;
    }
    pcVar4 = archive_entry_uname(entry);
    if ((((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) &&
        (wVar2 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv),
        wVar2 != L'\0')) &&
       (wVar3 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar3 == L'\xffffffe2')) {
      return L'\xffffffe2';
    }
    pcVar4 = archive_entry_gname(entry);
    if (((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) &&
       ((wVar2 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
        wVar2 != L'\0' &&
        (wVar3 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar3 == L'\xffffffe2')))) {
      return L'\xffffffe2';
    }
    if ((byte)(*(char *)((long)h + 0x9c) - 0x33U) < 2) {
      wVar2 = archive_entry_rdev_is_set(entry);
      if (wVar2 == L'\0') {
        dVar6 = tar_atol((char *)((long)h + 0x149),8);
        archive_entry_set_rdevmajor(entry,dVar6);
        dVar6 = tar_atol((char *)((long)h + 0x151),8);
        archive_entry_set_rdevminor(entry,dVar6);
      }
    }
    else {
      archive_entry_set_rdev(entry,0);
    }
    tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  }
  return wVar3;
}

Assistant:

static int
header_ustar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	struct archive_string as;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;

	/* Copy name into an internal buffer to ensure null-termination. */
	const char *existing_pathname = archive_entry_pathname(entry);
	const wchar_t *existing_wcs_pathname = archive_entry_pathname_w(entry);
	if ((existing_pathname == NULL || existing_pathname[0] == '\0')
	    && (existing_wcs_pathname == NULL || existing_wcs_pathname[0] == '\0')) {
		archive_string_init(&as);
		if (header->prefix[0]) {
			archive_strncpy(&as, header->prefix, sizeof(header->prefix));
			if (as.s[archive_strlen(&as) - 1] != '/')
				archive_strappend_char(&as, '/');
			archive_strncat(&as, header->name, sizeof(header->name));
		} else {
			archive_strncpy(&as, header->name, sizeof(header->name));
		}
		if (archive_entry_copy_pathname_l(entry, as.s, archive_strlen(&as),
		    tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		archive_string_free(&as);
	}

	/* Handle rest of common fields. */
	r = header_common(a, tar, entry, h);
	if (r == ARCHIVE_FATAL)
		return (r);
	if (r < err)
		err = r;

	/* Handle POSIX ustar fields. */
	const char *existing_uname = archive_entry_uname(entry);
	if (existing_uname == NULL || existing_uname[0] == '\0') {
		if (archive_entry_copy_uname_l(entry,
		    header->uname, sizeof(header->uname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	const char *existing_gname = archive_entry_gname(entry);
	if (existing_gname == NULL || existing_gname[0] == '\0') {
		if (archive_entry_copy_gname_l(entry,
		    header->gname, sizeof(header->gname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	/* Parse out device numbers only for char and block specials. */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		if (!archive_entry_rdev_is_set(entry)) {
			archive_entry_set_rdevmajor(entry, (dev_t)
			    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
			archive_entry_set_rdevminor(entry, (dev_t)
			    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
		}
	} else {
		archive_entry_set_rdev(entry, 0);
	}

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}